

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp_header.cpp
# Opt level: O2

lsp_header * lscpp::parse_header(lsp_header *__return_storage_ptr__,transporter *t)

{
  int iVar1;
  Verbosity VVar2;
  uint uVar3;
  string *this;
  double __x;
  double __x_00;
  string local_60;
  string line;
  
  (*((t->impl_)._M_t.
     super___uniq_ptr_impl<lscpp::transporter::iface,_std::default_delete<lscpp::transporter::iface>_>
     ._M_t.
     super__Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
     .super__Head_base<0UL,_lscpp::transporter::iface_*,_false>._M_head_impl)->_vptr_iface[2])
            (&line);
  std::__cxx11::string::substr((ulong)&local_60,(ulong)&line);
  this = &local_60;
  iVar1 = std::__cxx11::string::compare((char *)this);
  std::__cxx11::string::~string((string *)this);
  if (iVar1 == 0) {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)&line);
    uVar3 = std::__cxx11::stoi(&local_60,(size_t *)0x0,10);
    this = (string *)(ulong)uVar3;
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    VVar2 = loguru::current_verbosity_cutoff();
    if (-3 < VVar2) {
      __x = (double)std::__cxx11::string::substr((ulong)&local_60,(ulong)&line);
      loguru::log(__x);
      std::__cxx11::string::~string((string *)&local_60);
    }
    __return_storage_ptr__->content_length = -1;
    (__return_storage_ptr__->content_type).
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  std::__cxx11::string::~string((string *)&line);
  if (iVar1 == 0) {
    (*((t->impl_)._M_t.
       super___uniq_ptr_impl<lscpp::transporter::iface,_std::default_delete<lscpp::transporter::iface>_>
       ._M_t.
       super__Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
       .super__Head_base<0UL,_lscpp::transporter::iface_*,_false>._M_head_impl)->_vptr_iface[2])
              (&line);
    if (line._M_string_length == 0) {
      __return_storage_ptr__->content_length = (int)this;
      (__return_storage_ptr__->content_type).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      std::__cxx11::string::~string((string *)&line);
    }
    else {
      std::__cxx11::string::~string((string *)&line);
      VVar2 = loguru::current_verbosity_cutoff();
      if (-3 < VVar2) {
        loguru::log(__x_00);
      }
      __return_storage_ptr__->content_length = -1;
      (__return_storage_ptr__->content_type).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

lsp_header parse_header(transporter &t) {
  int content_length;
  if (auto line = t.read_line();
      line.substr(0, 16).compare("Content-Length: ") == 0) {
    content_length = std::stoi(line.substr(16, std::string::npos));
  } else {
    LOG_F(ERROR,
          "Failed parsing header, got '%s' instead of 'Content-Length: '",
          line.substr(0, 16).c_str());
    return {-1}; // TODO return a proper error on failure.
  }

  if (auto line = t.read_line(); line.size() == 0) // a new line
    return {content_length};                       // valid header

  LOG_F(ERROR, "Failed parsing header!");
  return {-1};
}